

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  function<void_()> *this;
  char **in_RSI;
  int in_EDI;
  exception *e;
  service srv;
  submitter local_60;
  submitter local_58 [4];
  undefined1 local_38 [16];
  service local_28 [24];
  char **local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  basic_test();
  cppcms::service::service(local_28,local_8,local_10);
  this = (function<void_()> *)cppcms::service::applications_pool();
  cppcms::create_pool<unit_test>();
  cppcms::applications_pool::mount(this,local_38,0);
  std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
            ((shared_ptr<cppcms::application_specific_pool> *)0x10bfc7);
  submitter::submitter(&local_60,local_28);
  std::function<void()>::function<submitter,void>(this,local_58);
  cppcms::service::after_fork((function *)local_28);
  std::function<void_()>::~function((function<void_()> *)0x10c007);
  cppcms::service::run();
  cppcms::service::~service(local_28);
  return (uint)((run_ok & 1U) == 0);
}

Assistant:

int main(int argc,char **argv)
{
	try {
		basic_test();
		cppcms::service srv(argc,argv);
		srv.applications_pool().mount( cppcms::create_pool<unit_test>());
		srv.after_fork(submitter(srv));
		srv.run();
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return EXIT_FAILURE;
	}
	return run_ok ? EXIT_SUCCESS : EXIT_FAILURE;
}